

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O2

void Gli_ManVerify(Gli_Man_t *p)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    if ((p->nObjData <= (int)uVar3) || (piVar2 = p->pObjData, piVar2 == (int *)0x0)) {
      return;
    }
    uVar1 = piVar2[uVar3];
    if (((uVar1 >> 2 ^ uVar1 >> 1) & 1) != 0) {
      __assert_fail("pObj->fPhase == pObj->fPhase2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGlitch.c"
                    ,0x235,"void Gli_ManVerify(Gli_Man_t *)");
    }
    if (piVar2[(ulong)uVar3 + 6] < piVar2[(ulong)uVar3 + 5]) break;
    uVar3 = uVar3 + (uVar1 >> 7) + (uVar1 >> 4 & 7) + 7;
  }
  __assert_fail("pObj->nGlitches >= pObj->nSwitches",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGlitch.c"
                ,0x236,"void Gli_ManVerify(Gli_Man_t *)");
}

Assistant:

void Gli_ManVerify( Gli_Man_t * p )
{
    Gli_Obj_t * pObj;
    int i;
    Gli_ManForEachObj( p, pObj, i )
    {
        assert( pObj->fPhase == pObj->fPhase2 );
        assert( pObj->nGlitches >= pObj->nSwitches );
    }
}